

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pockle.c
# Opt level: O0

PockleStatus pockle_add_small_prime(Pockle *pockle,mp_int *p)

{
  uint uVar1;
  uintmax_t uVar2;
  ulong local_30;
  size_t i;
  uint32_t val;
  mp_int *p_local;
  Pockle *pockle_local;
  
  uVar1 = mp_hs_integer(p,0x100000000);
  if (uVar1 == 0) {
    uVar2 = mp_get_integer(p);
    uVar1 = (uint)uVar2;
    if (uVar1 < 2) {
      pockle_local._4_4_ = POCKLE_PRIME_SMALLER_THAN_2;
    }
    else {
      init_smallprimes();
      for (local_30 = 0; (local_30 < 0x198e && (uVar1 != smallprimes_array[local_30]));
          local_30 = local_30 + 1) {
        if (uVar1 % (uint)smallprimes_array[local_30] == 0) {
          return POCKLE_SMALL_PRIME_NOT_PRIME;
        }
      }
      pockle_local._4_4_ = pockle_insert(pockle,p,(mp_int **)0x0,0,(mp_int *)0x0);
    }
  }
  else {
    pockle_local._4_4_ = POCKLE_SMALL_PRIME_NOT_SMALL;
  }
  return pockle_local._4_4_;
}

Assistant:

PockleStatus pockle_add_small_prime(Pockle *pockle, mp_int *p)
{
    if (mp_hs_integer(p, (1ULL << 32)))
        return POCKLE_SMALL_PRIME_NOT_SMALL;

    uint32_t val = mp_get_integer(p);

    if (val < 2)
        return POCKLE_PRIME_SMALLER_THAN_2;

    init_smallprimes();
    for (size_t i = 0; i < NSMALLPRIMES; i++) {
        if (val == smallprimes[i])
            break; /* success */
        if (val % smallprimes[i] == 0)
            return POCKLE_SMALL_PRIME_NOT_PRIME;
    }

    return pockle_insert(pockle, p, NULL, 0, NULL);
}